

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

void correct_yolo_box(box *b,int im_w,int im_h,int net_w,int net_h)

{
  int new_h;
  int new_w;
  int net_h_local;
  int net_w_local;
  int im_h_local;
  int im_w_local;
  box *b_local;
  
  if ((float)net_h / (float)im_h <= (float)net_w / (float)im_w) {
    new_w = (im_w * net_h) / im_h;
    new_h = net_h;
  }
  else {
    new_h = (im_h * net_w) / im_w;
    new_w = net_w;
  }
  b->x = (b->x - ((float)(net_w - new_w) / 2.0) / (float)net_w) / ((float)new_w / (float)net_w);
  b->y = (b->y - ((float)(net_h - new_h) / 2.0) / (float)net_h) / ((float)new_h / (float)net_h);
  b->w = ((float)net_w / (float)new_w) * b->w;
  b->h = ((float)net_h / (float)new_h) * b->h;
  return;
}

Assistant:

static void correct_yolo_box(box & b, int im_w, int im_h, int net_w, int net_h)
{
    int new_w = 0;
    int new_h = 0;
    if (((float)net_w/im_w) < ((float)net_h/im_h)) {
        new_w = net_w;
        new_h = (im_h * net_w)/im_w;
    } else {
        new_h = net_h;
        new_w = (im_w * net_h)/im_h;
    }
    b.x = (b.x - (net_w - new_w)/2./net_w) / ((float)new_w/net_w);
    b.y = (b.y - (net_h - new_h)/2./net_h) / ((float)new_h/net_h);
    b.w *= (float)net_w/new_w;
    b.h *= (float)net_h/new_h;
}